

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

void __thiscall QDockWidget::initStyleOption(QDockWidget *this,QStyleOptionDockWidget *option)

{
  undefined8 uVar1;
  undefined8 uVar2;
  QDockWidgetPrivate *d;
  long lVar3;
  long lVar4;
  long lVar5;
  QWidget *widget;
  
  if (option != (QStyleOptionDockWidget *)0x0) {
    lVar5 = *(long *)&(this->super_QWidget).field_0x8;
    QWidget::layout(&this->super_QWidget);
    lVar3 = QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
    lVar4 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
    widget = &this->super_QWidget;
    if ((lVar4 != 0) &&
       (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
      widget = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
    }
    QStyleOption::initFrom(&option->super_QStyleOption,widget);
    uVar1 = *(undefined8 *)(lVar3 + 0x38);
    uVar2 = *(undefined8 *)(lVar3 + 0x40);
    (option->super_QStyleOption).rect.x1 = (Representation)(int)uVar1;
    (option->super_QStyleOption).rect.y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
    (option->super_QStyleOption).rect.x2 = (Representation)(int)uVar2;
    (option->super_QStyleOption).rect.y2 = (Representation)(int)((ulong)uVar2 >> 0x20);
    QString::operator=(&option->title,(QString *)(lVar5 + 0x290));
    lVar5 = *(long *)&(this->super_QWidget).field_0x8;
    option->closable = (bool)(*(byte *)(lVar5 + 0x260) & 1);
    option->movable = (bool)(*(byte *)(lVar5 + 0x260) >> 1 & 1);
    option->floatable = (bool)(*(byte *)(lVar5 + 0x260) >> 2 & 1);
    QWidget::layout(&this->super_QWidget);
    lVar5 = QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
    option->verticalTitleBar = *(bool *)(lVar5 + 0x1c);
  }
  return;
}

Assistant:

void QDockWidget::initStyleOption(QStyleOptionDockWidget *option) const
{
    Q_D(const QDockWidget);

    if (!option)
        return;
    QDockWidgetLayout *dwlayout = qobject_cast<QDockWidgetLayout*>(layout());

    QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow*>(parent());
    // If we are in a floating tab, init from the parent because the attributes and the geometry
    // of the title bar should be taken from the floating window.
    option->initFrom(floatingTab && !isFloating() ? parentWidget() : this);
    option->rect = dwlayout->titleArea();
    option->title = d->fixedWindowTitle;
    option->closable = hasFeature(this, QDockWidget::DockWidgetClosable);
    option->movable = hasFeature(this, QDockWidget::DockWidgetMovable);
    option->floatable = hasFeature(this, QDockWidget::DockWidgetFloatable);

    QDockWidgetLayout *l = qobject_cast<QDockWidgetLayout*>(layout());
    option->verticalTitleBar = l->verticalTitleBar;
}